

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::dec_writer::operator()
          (dec_writer *this,wchar_t **it)

{
  undefined1 value [16];
  wchar_t *pwVar1;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  wchar_t *in_stack_00000008;
  int in_stack_ffffffffffffffec;
  
  value._8_8_ = in_RDI;
  value._0_8_ = in_RSI;
  pwVar1 = format_decimal<wchar_t,wchar_t*,unsigned__int128>
                     (in_stack_00000008,(unsigned___int128)value,in_stack_ffffffffffffffec);
  *in_RSI = pwVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }